

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

string * statusToString_abi_cxx11_
                   (string *__return_storage_ptr__,HighsBasisStatus status,double lower,double upper
                   )

{
  allocator *paVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(CONCAT71(in_register_00000031,status) & 0xffffffff) {
  case 0:
    if ((lower != upper) || (NAN(lower) || NAN(upper))) {
      pcVar2 = "LB";
      paVar1 = &local_a;
    }
    else {
      pcVar2 = "FX";
      paVar1 = &local_9;
    }
    break;
  case 1:
    pcVar2 = "BS";
    paVar1 = &local_b;
    break;
  case 2:
    if ((lower != upper) || (NAN(lower) || NAN(upper))) {
      pcVar2 = "UB";
      paVar1 = &local_d;
    }
    else {
      pcVar2 = "FX";
      paVar1 = &local_c;
    }
    break;
  case 3:
    pcVar2 = "FR";
    paVar1 = &local_e;
    break;
  case 4:
    pcVar2 = "NB";
    paVar1 = &local_f;
    break;
  default:
    pcVar2 = "";
    paVar1 = &local_10;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string statusToString(const HighsBasisStatus status, const double lower,
                           const double upper) {
  switch (status) {
    case HighsBasisStatus::kLower:
      if (lower == upper) {
        return "FX";
      } else {
        return "LB";
      }
      break;
    case HighsBasisStatus::kBasic:
      return "BS";
      break;
    case HighsBasisStatus::kUpper:
      if (lower == upper) {
        return "FX";
      } else {
        return "UB";
      }
      break;
    case HighsBasisStatus::kZero:
      return "FR";
      break;
    case HighsBasisStatus::kNonbasic:
      return "NB";
      break;
  }
  return "";
}